

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O2

bool AString_replaceRangeCString(AString *str,size_t index,size_t count,char *cstr,size_t len)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  
  bVar2 = false;
  if (str != (AString *)0x0) {
    if (cstr == (char *)0x0 || len == 0) {
      AString_remove(str,index,count);
    }
    else {
      uVar1 = str->size;
      sVar3 = uVar1 - index;
      if (uVar1 < index || sVar3 == 0) {
        bVar2 = AString_appendCString(str,cstr,len);
        return bVar2;
      }
      sVar4 = sVar3;
      if (count + index < uVar1) {
        sVar4 = count;
      }
      if (~index <= count) {
        sVar4 = sVar3;
      }
      if (sVar4 < len || sVar4 - len == 0) {
        if (sVar4 < len) {
          sVar3 = (len - sVar4) + uVar1;
          bVar2 = AString_reserve(str,sVar3);
          if (bVar2 == false) {
            return false;
          }
          memmove(str->buffer + len + index,str->buffer + sVar4 + index,
                  (str->size - (sVar4 + index)) + 1);
          str->size = sVar3;
        }
      }
      else {
        AString_remove(str,index,sVar4 - len);
      }
      memcpy(str->buffer + index,cstr,len);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceRangeCString(struct AString *str, size_t index, size_t count, const char *cstr, size_t len)
{
    if(str == nullptr) {
        return false;
    } else if(cstr == nullptr || len == 0) {
        AString_remove(str, index, count);
        return true;
    }
    if(index >= str->size)
        return AString_appendCString(str, cstr, len);
    if(count >= ((size_t) 0) - index - 1 || index + count >= str->size)
        count = str->size - index;
    if(len < count) {
        AString_remove(str, index, count - len);
    } else if(len > count) {
        size_t requiredSize = str->size + (len - count);
        if(!AString_reserve(str, requiredSize))
            return false;
        memmove(str->buffer + index + len, str->buffer + index + count, str->size - index - count + 1);
        str->size = requiredSize;
    }
    memcpy(str->buffer + index, cstr, len * sizeof(char));
    return true;
}